

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O1

int __thiscall DIS::IOEffect::getMarshalledSize(IOEffect *this)

{
  int iVar1;
  
  iVar1 = EntityID::getMarshalledSize(&this->_ioEffect);
  return iVar1 + 0xf;
}

Assistant:

int IOEffect::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordType
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 1;  // _ioStatus
   marshalSize = marshalSize + 1;  // _ioLinkType
   marshalSize = marshalSize + _ioEffect.getMarshalledSize();  // _ioEffect
   marshalSize = marshalSize + 1;  // _ioEffectDutyCycle
   marshalSize = marshalSize + 2;  // _ioEffectDuration
   marshalSize = marshalSize + 2;  // _ioProcess
   marshalSize = marshalSize + 2;  // _padding
    return marshalSize;
}